

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

void __thiscall gvr::PLYElement::readData(PLYElement *this,streambuf *in)

{
  long *plVar1;
  undefined8 *puVar2;
  pointer pPVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (0 < this->size) {
    uVar6 = 0;
    do {
      pPVar3 = (this->list).
               super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->list).
          super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
          ._M_impl.super__Vector_impl_data._M_finish != pPVar3) {
        lVar4 = 0x30;
        uVar5 = 0;
        do {
          plVar1 = *(long **)((long)&pPVar3->enc + lVar4);
          (**(code **)(*plVar1 + 0x10))(plVar1,in);
          puVar2 = *(undefined8 **)((long)&(pPVar3->name)._M_dataplus._M_p + lVar4);
          if (puVar2 != (undefined8 *)0x0) {
            (**(code **)*puVar2)
                      (puVar2,uVar6 & 0xffffffff,*(undefined8 *)((long)&pPVar3->enc + lVar4));
          }
          uVar5 = uVar5 + 1;
          pPVar3 = (this->list).
                   super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar4 = lVar4 + 0x40;
        } while (uVar5 < (ulong)((long)(this->list).
                                       super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >>
                                6));
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < this->size);
  }
  return;
}

Assistant:

void PLYElement::readData(std::streambuf *in)
{
  for (long i=0; i<size; i++)
  {
    for (size_t k=0; k<list.size(); k++)
    {
      list[k].readData(in, i);
    }
  }
}